

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8Codex.cpp
# Opt level: O0

LPCUTF8 utf8::PrevCharFull(LPCUTF8 ptr,LPCUTF8 start)

{
  LPCUTF8 puVar1;
  bool bVar2;
  byte *local_28;
  LPCUTF8 current;
  LPCUTF8 start_local;
  LPCUTF8 ptr_local;
  
  ptr_local = ptr;
  if (start < ptr) {
    local_28 = ptr + -1;
    while( true ) {
      bVar2 = false;
      if (start < local_28) {
        bVar2 = (*local_28 & 0xc0) == 0x80;
      }
      if (!bVar2) break;
      local_28 = local_28 + -1;
    }
    puVar1 = NextChar(local_28);
    if (puVar1 == ptr) {
      ptr_local = local_28;
    }
    else {
      ptr_local = ptr + -1;
    }
  }
  return ptr_local;
}

Assistant:

LPCUTF8 PrevCharFull(LPCUTF8 ptr, LPCUTF8 start)
    {
        if (ptr > start)
        {
            LPCUTF8 current = ptr - 1;
            while (current > start && (*current & 0xC0) == 0x80)
                current--;
            if (NextChar(current) == ptr)
                return current;

            // It is not a valid encoding, just go back one character.
            return ptr - 1;
        }
        else
            return ptr;
    }